

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::RasterizationSamplesTest::createMultisampleTestInstance
          (RasterizationSamplesTest *this,Context *context,VkPrimitiveTopology topology,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices,
          VkPipelineMultisampleStateCreateInfo *multisampleStateParams,
          VkPipelineColorBlendAttachmentState *colorBlendState)

{
  VkPipelineMultisampleStateCreateFlags *__return_storage_ptr__;
  uint uVar1;
  VkFormat VVar2;
  void *pvVar3;
  VkSampleMask *pVVar4;
  PtrData<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
  data;
  PtrData<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
  data_00;
  undefined4 uVar5;
  VkPipelineMultisampleStateCreateFlags VVar6;
  VkSampleCountFlagBits VVar7;
  VkBool32 VVar8;
  float fVar9;
  VkBool32 VVar10;
  VkBool32 VVar11;
  VkBlendFactor VVar12;
  VkBlendFactor VVar13;
  VkBlendOp VVar14;
  VkBlendFactor VVar15;
  VkBlendFactor VVar16;
  VkBlendOp VVar17;
  VkColorComponentFlags VVar18;
  bool bVar19;
  MultisampleRenderer *pMVar20;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  MultisampleRenderer *pMVar21;
  NotSupportedError *this_00;
  long lVar22;
  VkFormat VVar23;
  MultisampleRenderer *pMVar24;
  VkFormat *renderSize;
  VkPrimitiveTopology pTopology [2];
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> pVertices [2];
  UniqueBase<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
  local_40;
  
  pMVar20 = (MultisampleRenderer *)operator_new(0x68);
  uVar1 = this->m_modeFlags;
  pMVar20->m_context = context;
  pMVar20->_vptr_MultisampleRenderer = (_func_int **)&PTR__RasterizationSamplesInstance_00bce3d0;
  pMVar20->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  pMVar20->m_depthStencilFormat = VK_FORMAT_B8G8R8_USCALED;
  (pMVar20->m_renderSize).m_data[0] = 0x20;
  (pMVar20->m_renderSize).m_data[1] = topology;
  pMVar24 = pMVar20;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             &pMVar20->m_useDepth,vertices);
  __return_storage_ptr__ = &(pMVar20->m_multisampleStateParams).flags;
  generateVertices((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    *)__return_storage_ptr__,GEOMETRY_TYPE_OPAQUE_QUAD_NONZERO_DEPTH);
  renderSize = &pMVar20->m_depthStencilFormat;
  (pMVar24->m_multisampleStateParams).alphaToCoverageEnable = uVar1;
  (pMVar24->m_colorBlendState).blendEnable = 0;
  (pMVar24->m_colorBlendState).srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  if (uVar1 == 0) {
    pMVar21 = (MultisampleRenderer *)operator_new(0x2b0);
    MultisampleRenderer::MultisampleRenderer
              (pMVar21,context,pMVar24->m_colorFormat,(IVec2 *)renderSize,topology,vertices,
               multisampleStateParams,colorBlendState);
    pVertices[0].
    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    data._8_8_ = renderSize;
    data.ptr = pMVar24;
    de::details::
    MovePtr<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
    ::operator=((MovePtr<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
                 *)&pMVar20->m_colorBlendState,data);
    de::details::
    UniqueBase<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
    ::~UniqueBase((UniqueBase<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
                   *)pVertices);
  }
  else {
    if ((uVar1 & 3) == 1) {
      VVar23 = VK_FORMAT_D16_UNORM;
    }
    else {
      vki = Context::getInstanceInterface(context);
      physDevice = Context::getPhysicalDevice(context);
      VVar23 = VK_FORMAT_D24_UNORM_S8_UINT;
      bVar19 = isSupportedDepthStencilFormat(vki,physDevice,VK_FORMAT_D24_UNORM_S8_UINT);
      if (!bVar19) {
        VVar23 = VK_FORMAT_D32_SFLOAT_S8_UINT;
        bVar19 = isSupportedDepthStencilFormat(vki,physDevice,VK_FORMAT_D32_SFLOAT_S8_UINT);
        if (!bVar19) {
          this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_00,"Required depth/stencil format is not supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleTests.cpp"
                     ,0x3c0);
          __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
      }
    }
    pTopology[0] = (pMVar24->m_renderSize).m_data[1];
    pTopology[1] = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
              (pVertices,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &pMVar20->m_useDepth);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
              (pVertices + 1,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               __return_storage_ptr__);
    pMVar21 = (MultisampleRenderer *)operator_new(0x2b0);
    VVar2 = pMVar24->m_colorFormat;
    pMVar21->_vptr_MultisampleRenderer = (_func_int **)&PTR__MultisampleRenderer_00bce418;
    pMVar21->m_context = context;
    pMVar21->m_colorFormat = VVar2;
    pMVar21->m_depthStencilFormat = VVar23;
    tcu::Vector<int,_2>::Vector(&pMVar21->m_renderSize,(Vector<int,_2> *)renderSize);
    pMVar21->m_useDepth = (bool)((byte)uVar1 & 1);
    pMVar21->m_useStencil = (bool)((byte)uVar1 >> 1 & 1);
    uVar5 = *(undefined4 *)&multisampleStateParams->field_0x4;
    pvVar3 = multisampleStateParams->pNext;
    VVar6 = multisampleStateParams->flags;
    VVar7 = multisampleStateParams->rasterizationSamples;
    VVar8 = multisampleStateParams->sampleShadingEnable;
    fVar9 = multisampleStateParams->minSampleShading;
    pVVar4 = multisampleStateParams->pSampleMask;
    VVar10 = multisampleStateParams->alphaToCoverageEnable;
    VVar11 = multisampleStateParams->alphaToOneEnable;
    (pMVar21->m_multisampleStateParams).sType = multisampleStateParams->sType;
    *(undefined4 *)&(pMVar21->m_multisampleStateParams).field_0x4 = uVar5;
    (pMVar21->m_multisampleStateParams).pNext = pvVar3;
    (pMVar21->m_multisampleStateParams).flags = VVar6;
    (pMVar21->m_multisampleStateParams).rasterizationSamples = VVar7;
    (pMVar21->m_multisampleStateParams).sampleShadingEnable = VVar8;
    (pMVar21->m_multisampleStateParams).minSampleShading = fVar9;
    (pMVar21->m_multisampleStateParams).pSampleMask = pVVar4;
    (pMVar21->m_multisampleStateParams).alphaToCoverageEnable = VVar10;
    (pMVar21->m_multisampleStateParams).alphaToOneEnable = VVar11;
    VVar12 = colorBlendState->srcColorBlendFactor;
    VVar13 = colorBlendState->dstColorBlendFactor;
    VVar14 = colorBlendState->colorBlendOp;
    VVar15 = colorBlendState->srcAlphaBlendFactor;
    VVar16 = colorBlendState->dstAlphaBlendFactor;
    VVar17 = colorBlendState->alphaBlendOp;
    VVar18 = colorBlendState->colorWriteMask;
    (pMVar21->m_colorBlendState).blendEnable = colorBlendState->blendEnable;
    (pMVar21->m_colorBlendState).srcColorBlendFactor = VVar12;
    (pMVar21->m_colorBlendState).dstColorBlendFactor = VVar13;
    (pMVar21->m_colorBlendState).colorBlendOp = VVar14;
    (pMVar21->m_colorBlendState).srcAlphaBlendFactor = VVar15;
    (pMVar21->m_colorBlendState).dstAlphaBlendFactor = VVar16;
    (pMVar21->m_colorBlendState).alphaBlendOp = VVar17;
    (pMVar21->m_colorBlendState).colorWriteMask = VVar18;
    (pMVar21->m_colorImageAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    (pMVar21->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
         0;
    (pMVar21->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    (pMVar21->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    (pMVar21->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)0x0;
    (pMVar21->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
    m_internal = 0;
    (pMVar21->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    (pMVar21->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_device = (VkDevice)0x0;
    (pMVar21->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x0;
    (pMVar21->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
         = 0;
    (pMVar21->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    (pMVar21->m_resolveImageAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    (pMVar21->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device
         = (VkDevice)0x0;
    (pMVar21->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x0;
    (pMVar21->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
    m_internal = 0;
    (pMVar21->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
    .m_deviceIface = (DeviceInterface *)0x0;
    (pMVar21->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
    .m_device = (VkDevice)0x0;
    (pMVar21->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
    .m_allocator = (VkAllocationCallbacks *)0x0;
    (pMVar21->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
    m_internal = 0;
    (pMVar21->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    (pMVar21->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_device = (VkDevice)0x0;
    (pMVar21->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x0;
    (pMVar21->m_depthStencilImageAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    memset(&pMVar21->m_depthStencilAttachmentView,0,200);
    memset(&pMVar21->m_pipelineLayout,0,0x98);
    MultisampleRenderer::initialize(pMVar21,context,2,pTopology,pVertices);
    local_40.m_data.ptr = (MultisampleRenderer *)0x0;
    data_00._8_8_ = renderSize;
    data_00.ptr = pMVar24;
    de::details::
    MovePtr<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
    ::operator=((MovePtr<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
                 *)&pMVar20->m_colorBlendState,data_00);
    de::details::
    UniqueBase<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer,_de::DefaultDeleter<vkt::pipeline::(anonymous_namespace)::MultisampleRenderer>_>
    ::~UniqueBase(&local_40);
    lVar22 = 0x18;
    do {
      std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
      ~_Vector_base((_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     *)((long)&pVertices[0].
                               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar22));
      lVar22 = lVar22 + -0x18;
    } while (lVar22 != -0x18);
  }
  return (TestInstance *)pMVar24;
}

Assistant:

TestInstance* RasterizationSamplesTest::createMultisampleTestInstance (Context&										context,
																	   VkPrimitiveTopology							topology,
																	   const std::vector<Vertex4RGBA>&				vertices,
																	   const VkPipelineMultisampleStateCreateInfo&	multisampleStateParams,
																	   const VkPipelineColorBlendAttachmentState&	colorBlendState) const
{
	return new RasterizationSamplesInstance(context, topology, vertices, multisampleStateParams, colorBlendState, m_modeFlags);
}